

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_timing.cpp
# Opt level: O2

void Am_Main_Event_Loop(void)

{
  Am_Time deadline;
  Am_Time AStack_28;
  Am_Time local_20;
  
  Am_Time::Am_Time(&AStack_28);
  while (Am_Main_Loop_Go == true) {
    am_Handle_Timing_Events();
    Am_Time::operator=(&AStack_28,&local_20);
    Am_Time::~Am_Time(&local_20);
    Am_Update_All();
    Am_Drawonable::Process_Event(&AStack_28);
  }
  Am_Time::~Am_Time(&AStack_28);
  return;
}

Assistant:

void
Am_Main_Event_Loop()
{
  //// TODO: make exit when no windows are owned. (visible?)
  Am_Time deadline;
  while (Am_Main_Loop_Go) {
    deadline = am_Handle_Timing_Events();
    Am_Update_All();
    Am_Drawonable::Process_Event(deadline);
  }
}